

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::ControlPacketSerializableImpl::readFrom
          (ControlPacketSerializableImpl *this,uint8 *buffer,uint32 bufLength)

{
  SerializablePayload *pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  uint uVar6;
  uint8 *puVar7;
  uint32 local_3c;
  uint32 expLength;
  uint32 s;
  uint32 o;
  uint32 bufLength_local;
  uint8 *buffer_local;
  ControlPacketSerializableImpl *this_local;
  
  if (bufLength < 2) {
    this_local._4_4_ = 0xfffffffe;
  }
  else {
    this->header->typeAndFlags = *buffer;
    puVar7 = buffer + 1;
    this_local._4_4_ = Common::VBInt::readFrom(&this->remLength,puVar7,bufLength - 1);
    bVar2 = Common::isError(this_local._4_4_);
    if (!bVar2) {
      iVar3 = this_local._4_4_ + 1;
      puVar7 = puVar7 + this_local._4_4_;
      uVar4 = (bufLength - 1) - this_local._4_4_;
      uVar5 = Common::VBInt::operator_cast_to_unsigned_int(&this->remLength);
      if (uVar4 < uVar5) {
        this_local._4_4_ = 0xfffffffe;
      }
      else {
        (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[6])
                  (this->fixedVariableHeader,(ulong)uVar5);
        local_3c = (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[2])
                             (this->fixedVariableHeader,puVar7,(ulong)uVar4);
        bVar2 = Common::isError(local_3c);
        if (bVar2) {
          bVar2 = Common::isShortcut(local_3c);
          if (bVar2) {
            local_3c = iVar3 + uVar5;
          }
          this_local._4_4_ = local_3c;
        }
        else {
          this_local._4_4_ =
               (*(this->props->super_Serializable)._vptr_Serializable[2])
                         (this->props,puVar7 + local_3c,(ulong)(uVar4 - local_3c));
          bVar2 = Common::isError(this_local._4_4_);
          if (!bVar2) {
            iVar3 = this_local._4_4_ + local_3c + iVar3;
            pSVar1 = this->payload;
            uVar6 = (*(this->super_ControlPacketSerializable).super_Serializable._vptr_Serializable
                      [5])(this,0);
            (*(pSVar1->super_EmptySerializable).super_Serializable._vptr_Serializable[6])
                      (pSVar1,(ulong)uVar6);
            this_local._4_4_ =
                 (*(this->payload->super_EmptySerializable).super_Serializable._vptr_Serializable[2]
                 )(this->payload,puVar7 + local_3c + this_local._4_4_,
                   (ulong)((uVar4 - local_3c) - this_local._4_4_));
            bVar2 = Common::isError(this_local._4_4_);
            if (!bVar2) {
              this_local._4_4_ = iVar3 + this_local._4_4_;
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    uint32 o = 1; const_cast<uint8&>(header.typeAndFlags) = buffer[0];

                    buffer += o; bufLength -= o;

                    uint32 s = remLength.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    uint32 expLength = (uint32)remLength;
                    if (bufLength < expLength) return NotEnoughData;

                    fixedVariableHeader.setRemainingLength(expLength);
                    s = fixedVariableHeader.readFrom(buffer, bufLength);
                    if (isError(s)) return isShortcut(s) ? o + expLength : s;
                    o += s; buffer += s; bufLength -= s;

                    s = props.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;

                    payload.setExpectedPacketSize(computePacketSize(false));
                    s = payload.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    return o + s;
                }